

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O0

void __thiscall FloatingDisplay::FloatingDisplay(FloatingDisplay *this,QWidget *mainWindow)

{
  QCursor *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Master *this_00;
  QSettings *pQVar5;
  int *piVar6;
  LCDWidget *pLVar7;
  MidiMessageLEDWidget *this_01;
  QWidget *this_02;
  QRect *pQVar8;
  undefined1 auVar9 [16];
  QPoint local_150;
  QSize local_148;
  QVariant local_140;
  QString local_120;
  QVariant local_108;
  undefined1 auStack_e8 [8];
  QRect rect;
  QSize local_d0;
  QCursor local_c8 [12];
  QFlags<Qt::WindowType> local_bc;
  int local_b8;
  int local_b4;
  int frameWithMargin;
  QString local_90;
  QVariant local_78;
  int local_54;
  QSettings *pQStack_50;
  int storedOpacity;
  QSettings *settings;
  Int local_1c;
  QWidget *local_18;
  QWidget *mainWindow_local;
  FloatingDisplay *this_local;
  
  local_18 = mainWindow;
  mainWindow_local = (QWidget *)this;
  local_1c = (Int)makeWindowFlags();
  QFrame::QFrame(&this->super_QFrame,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_1c);
  *(undefined ***)this = &PTR_metaObject_0020e1f0;
  *(undefined ***)&this->field_0x10 = &PTR__FloatingDisplay_0020e3a8;
  this->mainWindow = local_18;
  this->synthRoute = (SynthRoute *)0x0;
  this->lcdWidget = (LCDWidget *)0x0;
  this->midiMessageLED = (MidiMessageLEDWidget *)0x0;
  this->dragStatus = DRAG_STATUS_OFF;
  QPoint::QPoint(&this->dragOrigin);
  QPoint::QPoint(&this->startWindowPosition);
  QFrame::setFrameShape((Shadow)this);
  QFrame::setFrameShadow((Shadow)this);
  QString::QString((QString *)&settings,"Munt: Display");
  QWidget::setWindowTitle((QString *)this);
  QString::~QString((QString *)&settings);
  this_00 = Master::getInstance();
  pQVar5 = Master::getSettings(this_00);
  pQStack_50 = pQVar5;
  QString::QString(&local_90,"FloatingDisplay/opacity");
  QVariant::QVariant((QVariant *)&frameWithMargin,100);
  QSettings::value((QString *)&local_78,(QVariant *)pQVar5);
  iVar3 = QVariant::toInt((bool *)&local_78);
  QVariant::~QVariant(&local_78);
  QVariant::~QVariant((QVariant *)&frameWithMargin);
  QString::~QString(&local_90);
  local_b4 = 100;
  local_54 = iVar3;
  piVar6 = qBound<int>(&MIN_OPACITY_VALUE,&local_54,&local_b4);
  QWidget::setWindowOpacity((double)*piVar6 / 100.0);
  local_b8 = QFrame::frameWidth();
  local_b8 = local_b8 + 2;
  pLVar7 = (LCDWidget *)operator_new(0x78);
  LCDWidget::LCDWidget(pLVar7,(QWidget *)this);
  this->lcdWidget = pLVar7;
  pLVar7 = this->lcdWidget;
  iVar3 = QFrame::frameWidth();
  QWidget::move(&pLVar7->super_QWidget,iVar3 + 2,local_b8);
  this_01 = (MidiMessageLEDWidget *)operator_new(0x30);
  MidiMessageLEDWidget::MidiMessageLEDWidget(this_01,(QWidget *)this);
  this->midiMessageLED = this_01;
  this_02 = (QWidget *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_bc);
  QWidget::QWidget(this_02,(QWidget *)this,(QFlags_conflict1 *)(ulong)local_bc.i);
  this->sizeGrip = this_02;
  QWidget::resize((QSize *)this->sizeGrip);
  pQVar1 = (QCursor *)this->sizeGrip;
  QCursor::QCursor(local_c8,SizeFDiagCursor);
  QWidget::setCursor(pQVar1);
  QCursor::~QCursor(local_c8);
  local_d0 = (QSize)(**(code **)(*(long *)this->lcdWidget + 0x70))();
  iVar3 = QSize::width(&local_d0);
  iVar4 = QSize::width(&MIDI_MESSAGE_LED_SIZE);
  pQVar5 = pQStack_50;
  this->baseWindowWidth = iVar3 + iVar4 + 4 + local_b8 * 2;
  QString::QString(&local_120,"FloatingDisplay/geometry");
  QVariant::QVariant(&local_140);
  QSettings::value((QString *)&local_108,(QVariant *)pQVar5);
  auVar9 = QVariant::toRect();
  rect._0_8_ = auVar9._8_8_;
  auStack_e8 = auVar9._0_8_;
  QVariant::~QVariant(&local_108);
  QVariant::~QVariant(&local_140);
  QString::~QString(&local_120);
  bVar2 = QRect::isValid((QRect *)auStack_e8);
  if (bVar2) {
    iVar3 = QRect::width((QRect *)auStack_e8);
    layoutWidgets(this,iVar3);
    local_148 = QWidget::size((QWidget *)this);
    QRect::setSize((QRect *)auStack_e8,&local_148);
  }
  else {
    layoutWidgets(this,this->baseWindowWidth);
    pQVar8 = QWidget::geometry((QWidget *)this);
    auStack_e8._0_4_ = pQVar8->x1;
    auStack_e8._4_4_ = pQVar8->y1;
    rect.x1 = pQVar8->x2;
    rect.y1 = pQVar8->y2;
    pQVar8 = QWidget::geometry(local_18);
    local_150 = QRect::center(pQVar8);
    QRect::moveCenter((QRect *)auStack_e8,&local_150);
  }
  QRect::topLeft((QRect *)auStack_e8);
  QWidget::move((QPoint *)this);
  adjustGeometryToScreen(this);
  return;
}

Assistant:

FloatingDisplay::FloatingDisplay(const QWidget *mainWindow) :
	QFrame(NULL, makeWindowFlags()),
	mainWindow(mainWindow), synthRoute(), lcdWidget(), midiMessageLED(), dragStatus()
{
	setFrameShape(QFrame::Box);
	setFrameShadow(QFrame::Raised);
	setWindowTitle("Munt: Display");

	QSettings *settings = Master::getInstance()->getSettings();
	int storedOpacity = settings->value("FloatingDisplay/opacity", 100).toInt();
	setWindowOpacity(qreal(qBound(MIN_OPACITY_VALUE, storedOpacity, 100) / 100.0));

	int frameWithMargin = frameWidth() + CONTENT_MARGIN;

	lcdWidget = new LCDWidget(this);
	lcdWidget->move(frameWidth() + CONTENT_MARGIN, frameWithMargin);

	midiMessageLED = new MidiMessageLEDWidget(this);

	sizeGrip = new QWidget(this);
	sizeGrip->resize(SIZE_GRIP_SIZE);
	sizeGrip->setCursor(Qt::SizeFDiagCursor);

	baseWindowWidth = lcdWidget->sizeHint().width() + MIDI_MESSAGE_LED_SIZE.width() + 2 * frameWithMargin + LAYOUT_SPACING;
	QRect rect = settings->value("FloatingDisplay/geometry").toRect();
	if (rect.isValid()) {
		layoutWidgets(rect.width());
		rect.setSize(size());
	} else {
		layoutWidgets(baseWindowWidth);
		rect = geometry();
		rect.moveCenter(mainWindow->geometry().center());
	}
	move(rect.topLeft());
	adjustGeometryToScreen();
}